

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  sysbvm_tuple_t sVar5;
  intptr_t iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  long lVar12;
  
  uVar2 = *(ulong *)(dictionary + 0x18);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar1 = *(uint *)(uVar2 + 0xc);
    uVar7 = uVar1 >> 4;
    uVar9 = 8;
    if (0x3f < uVar1) {
      uVar9 = (ulong)(uVar1 >> 3 & 0xfffffffe);
    }
  }
  else {
    uVar7 = 0;
    uVar9 = 8;
  }
  sVar5 = sysbvm_array_create(context,(ulong)(uint)((int)uVar9 * 2));
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar5;
  auVar4 = _DAT_001687c0;
  if (uVar9 != 0) {
    lVar8 = uVar9 - 1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar10 = auVar10 ^ _DAT_001687c0;
    auVar11 = _DAT_001687b0;
    do {
      auVar13 = auVar11 ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        *(undefined8 *)(sVar5 + 0x10 + lVar8) = 0x3f;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        *(undefined8 *)(sVar5 + 0x20 + lVar8) = 0x3f;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 << 4 != lVar8);
  }
  if (uVar7 != 0) {
    uVar9 = 0;
    do {
      sVar5 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar9);
      if (sVar5 != 0x3f) {
        uVar3 = *(undefined8 *)(uVar2 + 0x18 + uVar9);
        iVar6 = sysbvm_methodDictionary_scanFor(dictionary,sVar5);
        if (iVar6 < 0) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:662: assertion failure: elementIndex >= 0"
                    );
        }
        lVar8 = *(long *)(dictionary + 0x18);
        *(sysbvm_tuple_t *)(lVar8 + 0x10 + iVar6 * 0x10) = sVar5;
        *(undefined8 *)(lVar8 + 0x18 + iVar6 * 0x10) = uVar3;
      }
      uVar9 = uVar9 + 0x10;
    } while (uVar7 << 4 != uVar9);
  }
  return;
}

Assistant:

static void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity*2);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i*2] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t key = oldStorage->elements[i*2];
        sysbvm_tuple_t value = oldStorage->elements[i*2 + 1];
        if(key != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_methodDictionary_insertNoCheck(dictionary, key, value);
    }
}